

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

Float __thiscall
pbrt::HairBxDF::PDF(HairBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
                   BxDFReflTransFlags sampleFlags)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  Float sinTheta_o;
  undefined1 auVar8 [16];
  int p;
  int iVar9;
  long lVar10;
  undefined1 auVar11 [16];
  float sinTheta_o_00;
  float fVar12;
  float fVar13;
  float fVar14;
  Float FVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar18 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar19 [64];
  undefined1 auVar21 [56];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  float cosTheta_o;
  undefined8 in_XMM2_Qb;
  undefined1 in_register_00001344 [12];
  array<float,_4> aVar27;
  array<float,_4> apPDF;
  uint local_c8;
  ulong uStack_b0;
  float local_a8;
  undefined1 local_78 [16];
  Float local_68;
  undefined1 local_20 [16];
  undefined1 auVar26 [56];
  
  auVar19._8_56_ = wo._8_56_;
  auVar19._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  sinTheta_o_00 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar11 = vmovshdup_avx(auVar19._0_16_);
  fVar12 = atan2f(wo.super_Tuple3<pbrt::Vector3,_float>.z,auVar11._0_4_);
  auVar11._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8 = 0;
  auVar4 = vmovshdup_avx(auVar11);
  auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - local_68 * local_68)),ZEXT816(0) << 0x40);
  auVar5 = vsqrtss_avx(auVar11,auVar11);
  fVar13 = atan2f(wi.super_Tuple3<pbrt::Vector3,_float>.z,auVar4._0_4_);
  auVar11 = vfmsub213ss_fma(ZEXT416((uint)this->eta),ZEXT416((uint)this->eta),
                            ZEXT416((uint)(sinTheta_o_00 * sinTheta_o_00)));
  auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)(1.0 - sinTheta_o_00 * sinTheta_o_00)),0x10);
  auVar11 = vmaxps_avx(auVar11,ZEXT816(0) << 0x40);
  auVar11 = vsqrtps_avx(auVar11);
  auVar4 = vmovshdup_avx(auVar11);
  cosTheta_o = auVar4._0_4_;
  auVar22 = ZEXT416((uint)(this->h / (auVar11._0_4_ / cosTheta_o)));
  auVar26 = ZEXT856(0);
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar22);
  uVar6 = vcmpss_avx512f(auVar22,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  fVar14 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar11._0_4_));
  uStack_b0 = auVar4._8_8_;
  auVar21 = ZEXT856(uStack_b0);
  aVar27 = ComputeApPDF(this,cosTheta_o);
  auVar25._0_8_ = aVar27.values._8_8_;
  auVar25._8_56_ = auVar26;
  auVar20._0_8_ = aVar27.values._0_8_;
  auVar20._8_56_ = auVar21;
  local_20 = vmovlhps_avx(auVar20._0_16_,auVar25._0_16_);
  lVar10 = 0;
  do {
    iVar9 = (int)lVar10;
    if (iVar9 == 2) {
      FVar15 = this->sin2kAlpha[2];
      FVar1 = this->cos2kAlpha[2];
LAB_0040507d:
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(cosTheta_o * FVar15)),ZEXT416((uint)FVar1),
                                ZEXT416((uint)sinTheta_o_00));
      sinTheta_o = auVar11._0_4_;
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(FVar15 * -sinTheta_o_00)),auVar4,ZEXT416((uint)FVar1)
                               );
    }
    else {
      if (iVar9 == 1) {
        FVar15 = this->sin2kAlpha[0];
        FVar1 = this->cos2kAlpha[0];
        goto LAB_0040507d;
      }
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(sinTheta_o_00 * this->sin2kAlpha[1])),
                                ZEXT416((uint)this->cos2kAlpha[1]),ZEXT416((uint)cosTheta_o));
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * -cosTheta_o)),auVar19._0_16_,
                                ZEXT416((uint)this->cos2kAlpha[1]));
      sinTheta_o = auVar22._0_4_;
    }
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(auVar11,auVar22);
    FVar15 = Mp(auVar5._0_4_,auVar11._0_4_,local_68,sinTheta_o,this->v[lVar10]);
    auVar23._0_4_ = (float)(iVar9 * 2);
    auVar23._4_12_ = in_register_00001344;
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(this->gamma_o * -2.0)),auVar23,ZEXT416((uint)fVar14));
    auVar24._0_4_ = (float)iVar9;
    auVar24._4_12_ = in_register_00001344;
    auVar11 = vfmadd213ss_fma(auVar24,SUB6416(ZEXT464(0x40490fdb),0),auVar11);
    for (fVar16 = (fVar13 - fVar12) - auVar11._0_4_; 3.1415927 < fVar16;
        fVar16 = fVar16 + -6.2831855) {
    }
    fVar2 = *(float *)(local_20 + lVar10 * 4);
    fVar3 = this->s;
    for (; fVar16 < -3.1415927; fVar16 = fVar16 + 6.2831855) {
    }
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar11 = vorps_avx512vl(ZEXT416((uint)fVar16),auVar8);
    fVar16 = auVar11._0_4_ / fVar3;
    local_78._0_4_ = expf(fVar16);
    local_78._4_4_ = extraout_XMM0_Db;
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._12_4_ = extraout_XMM0_Dd;
    fVar16 = expf(fVar16);
    fVar17 = expf(-3.1415927 / fVar3);
    auVar22 = vinsertps_avx(ZEXT416((uint)(fVar3 * (fVar16 + 1.0) * (fVar16 + 1.0))),
                            ZEXT416((uint)(fVar17 + 1.0)),0x10);
    auVar11 = vblendps_avx(local_78,_DAT_004a5500,0xe);
    auVar11 = vdivps_avx(auVar11,auVar22);
    fVar16 = expf(3.1415927 / fVar3);
    lVar10 = lVar10 + 1;
    auVar22 = vmovshdup_avx(auVar11);
    auVar18._0_4_ = auVar11._0_4_ / (auVar22._0_4_ - 1.0 / (fVar16 + 1.0));
    auVar18._4_12_ = auVar11._4_12_;
    auVar11 = vfmadd231ss_fma(ZEXT416(local_c8),auVar18,ZEXT416((uint)(FVar15 * fVar2)));
    local_c8 = auVar11._0_4_;
    if (lVar10 == 3) {
      auVar11 = vmovshdup_avx(auVar25._0_16_);
      FVar15 = Mp(auVar5._0_4_,cosTheta_o,local_68,sinTheta_o_00,this->v[3]);
      local_a8 = auVar11._0_4_;
      auVar11 = vfmadd231ss_fma(ZEXT416(local_c8),ZEXT416((uint)(FVar15 * local_a8)),
                                ZEXT416(0x3e22f983));
      return auVar11._0_4_;
    }
  } while( true );
}

Assistant:

Float HairBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                    BxDFReflTransFlags sampleFlags) const {
    // TODO? flags...

    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Compute hair coordinate system terms related to _wi_
    Float sinTheta_i = wi.x;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));
    Float phi_i = std::atan2(wi.z, wi.y);

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute PDF for $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);

    // Compute PDF sum for hair scattering events
    Float phi = phi_i - phi_o;
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Compute $\sin \thetao$ and $\cos \thetao$ terms accounting for scales
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        }

        // Handle remainder of $p$ values for hair scale tilt
        else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);
        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(phi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    return pdf;
}